

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_resize_aux(REF_NODE ref_node)

{
  REF_DBL *pRVar1;
  REF_NODE ref_node_local;
  
  if (ref_node->aux == (REF_DBL *)0x0) {
    if (ref_node->naux * ref_node->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa79,
             "ref_node_resize_aux","malloc ref_node->aux of REF_DBL negative");
      return 1;
    }
    pRVar1 = (REF_DBL *)malloc((long)(ref_node->naux * ref_node->max) << 3);
    ref_node->aux = pRVar1;
    if (ref_node->aux == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa79,
             "ref_node_resize_aux","malloc ref_node->aux of REF_DBL NULL");
      return 2;
    }
  }
  else {
    fflush(_stdout);
    if (0 < ref_node->naux * ref_node->max) {
      pRVar1 = (REF_DBL *)realloc(ref_node->aux,(long)(ref_node->naux * ref_node->max) << 3);
      ref_node->aux = pRVar1;
    }
    if (ref_node->aux == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa7c,
             "ref_node_resize_aux","realloc ref_node->aux NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
             (ulong)(uint)(ref_node->naux * ref_node->max),(long)(ref_node->naux * ref_node->max),8,
             (long)(ref_node->naux * ref_node->max) << 3);
      return 2;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_resize_aux(REF_NODE ref_node) {
  if (NULL == ref_node->aux) {
    ref_malloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
               REF_DBL);
  } else {
    ref_realloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
                REF_DBL);
  }
  return REF_SUCCESS;
}